

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool TestLowbitsCollisions<Blob<256>>(vector<Blob<256>,_std::allocator<Blob<256>_>_> *revhashes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_RDI;
  double dVar4;
  double dev;
  double expected;
  int nbColls;
  int b;
  double maxCollDevExp;
  int maxCollDevNb;
  int maxCollDevBits;
  double maxCollDev;
  int maxBits;
  int minBits;
  size_t nbH;
  int origBits;
  undefined8 in_stack_ffffffffffffffa8;
  int minCollisions;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  double dVar5;
  uint local_38;
  uint local_34;
  double local_30;
  bool local_1;
  
  minCollisions = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(in_RDI);
  uVar1 = FindMinBits_TargetCollisionShare
                    (in_stack_ffffffffffffffc0,
                     (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar2 = FindMaxBits_TargetCollisionNb(in_stack_ffffffffffffffb0,minCollisions);
  if (((int)uVar2 < 1) || (0xff < (int)uVar2)) {
    local_1 = true;
  }
  else {
    printf("Testing collisions (low  %2i-%2i bits) - ",(ulong)uVar1,(ulong)uVar2);
    local_30 = 0.0;
    local_34 = 0;
    local_38 = 0;
    dVar5 = 1.0;
    for (; (int)uVar1 <= (int)uVar2; uVar1 = uVar1 + 1) {
      uVar3 = CountNbCollisions<Blob<256>>(_nbColls,expected._4_4_);
      dVar4 = EstimateNbCollisions((int)((ulong)dVar5 >> 0x20),SUB84(dVar5,0));
      if (local_30 < (double)(int)uVar3 / dVar4) {
        dVar5 = dVar4;
        local_38 = uVar3;
        local_34 = uVar1;
        local_30 = (double)(int)uVar3 / dVar4;
      }
    }
    printf("Worst is %2i bits: %2i/%2i (%.2fx)",local_30,(ulong)local_34,(ulong)local_38,(int)dVar5)
    ;
    if (local_30 <= 2.0) {
      printf("\n");
      local_1 = true;
    }
    else {
      printf(" !!!!!\n");
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool TestLowbitsCollisions ( std::vector<hashtype> & revhashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = revhashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits <= 0 || maxBits >= origBits) return true;

  printf("Testing collisions (low  %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(revhashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}